

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O2

void __thiscall Writer::writeBlock(Writer *this,Block *block)

{
  pointer ppEVar1;
  bool bVar2;
  pointer Val;
  allocator local_51;
  string local_50;
  
  CWriter::indent(&this->wr,1);
  CWriter::startBlock(&this->wr,&block->blockName);
  ppEVar1 = (block->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (Val = (block->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
             super__Vector_impl_data._M_start; Val != ppEVar1; Val = Val + 1) {
    CWriter::indent(&this->wr,1);
    (*(*Val)->_vptr_Expr[2])(*Val,&this->ew);
    bVar2 = llvm::isa_impl_wrap<IfExpr,_Expr_*const,_const_Expr_*>::doit(Val);
    if (!bVar2) {
      bVar2 = llvm::isa_impl_wrap<SwitchExpr,_Expr_*const,_const_Expr_*>::doit(Val);
      if (!bVar2) {
        bVar2 = llvm::isa_impl_wrap<ExprList,_Expr_*const,_const_Expr_*>::doit(Val);
        if (!bVar2) {
          std::__cxx11::string::string((string *)&local_50,";",&local_51);
          CWriter::line(&this->wr,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void Writer::writeBlock(const Block* block) {
    wr.indent(1);
    wr.startBlock(block->blockName);

    for (const auto& expr : block->expressions) {
        wr.indent(1);
        expr->accept(ew);
        if (!llvm::isa<IfExpr>(expr) && !llvm::isa<SwitchExpr>(expr) && !llvm::isa<ExprList>(expr)) {
            wr.line(";");
        }
    }
}